

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClassType::inheritMembers
          (ClassType *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  LookupLocation lookupLocation;
  ClassDeclarationSyntax *pCVar1;
  Symbol *in_RDI;
  ClassDeclarationSyntax *classSyntax;
  ASTContext context;
  SyntaxNode *syntax;
  ASTContext *in_stack_000003b0;
  ExtendsClauseSyntax *in_stack_000003b8;
  ClassType *in_stack_000003c0;
  function_ref<void_(const_slang::ast::Symbol_&)> in_stack_000003c8;
  ASTContext *in_stack_000006e0;
  ImplementsClauseSyntax *in_stack_000006e8;
  ClassType *in_stack_000006f0;
  function_ref<void_(const_slang::ast::Symbol_&)> in_stack_000006f8;
  ASTContext *in_stack_ffffffffffffff68;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff70;
  Scope *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  bitmask<slang::ast::ASTFlags> local_70;
  LookupLocation local_68 [4];
  SyntaxNode *local_20;
  
  local_20 = Symbol::getSyntax(in_RDI);
  LookupLocation::LookupLocation
            (local_68,(Scope *)&in_RDI[1].name,*(uint32_t *)&in_RDI[3].field_0x34);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_70,None);
  lookupLocation._8_8_ = in_stack_ffffffffffffff80;
  lookupLocation.scope = in_stack_ffffffffffffff78;
  ASTContext::ASTContext
            (in_stack_ffffffffffffff68,(Scope *)in_RDI,lookupLocation,in_stack_ffffffffffffff70);
  pCVar1 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>(local_20);
  if (pCVar1->extendsClause != (ExtendsClauseSyntax *)0x0) {
    handleExtends(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,in_stack_000003c8);
  }
  if (pCVar1->implementsClause != (ImplementsClauseSyntax *)0x0) {
    handleImplements(in_stack_000006f0,in_stack_000006e8,in_stack_000006e0,in_stack_000006f8);
  }
  return;
}

Assistant:

void ClassType::inheritMembers(function_ref<void(const Symbol&)> insertCB) const {
    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (classSyntax.extendsClause)
        handleExtends(*classSyntax.extendsClause, context, insertCB);

    if (classSyntax.implementsClause)
        handleImplements(*classSyntax.implementsClause, context, insertCB);
}